

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O0

void __thiscall leveldb::FindFileTest::~FindFileTest(FindFileTest *this)

{
  FileMetaData *this_00;
  size_type sVar1;
  reference ppFVar2;
  int local_14;
  int i;
  FindFileTest *this_local;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__FindFileTest_001bb440;
  local_14 = 0;
  while( true ) {
    sVar1 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      (&this->files_);
    if (sVar1 <= (ulong)(long)local_14) break;
    ppFVar2 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
              operator[](&this->files_,(long)local_14);
    this_00 = *ppFVar2;
    if (this_00 != (FileMetaData *)0x0) {
      FileMetaData::~FileMetaData(this_00);
      operator_delete(this_00);
    }
    local_14 = local_14 + 1;
  }
  std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::~vector
            (&this->files_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

~FindFileTest() {
    for (int i = 0; i < files_.size(); i++) {
      delete files_[i];
    }
  }